

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

nodeclass * NodeContext_FindClassEx(anynode *AnyNode,fourcc_t ClassId,nodemodule *Module)

{
  nodecontext *p;
  nodeclass *pnVar1;
  
  if (ClassId == 0) {
    pnVar1 = (nodeclass *)0x0;
  }
  else {
    if (AnyNode == (anynode *)0x0) {
      __assert_fail("(const void*)(AnyNode)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x125,
                    "const nodeclass *NodeContext_FindClassEx(anynode *, fourcc_t, nodemodule *)");
    }
    p = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
    pnVar1 = FindModuleClass(p,ClassId,Module);
    if (pnVar1 == (nodeclass *)0x0) {
      pnVar1 = NodeContext_FindClass(p,ClassId);
      return pnVar1;
    }
  }
  return pnVar1;
}

Assistant:

NOINLINE const nodeclass* NodeContext_FindClassEx(anynode* AnyNode,fourcc_t ClassId,nodemodule* Module)
{
    const nodeclass* Class = NULL;
    if (ClassId)
    {
        nodecontext* p = Node_Context(AnyNode);

        Class = FindModuleClass(p,ClassId,Module);
        if (!Class)
            Class = NodeContext_FindClass(p,ClassId);
    }
    return Class;
}